

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

void __thiscall Potassco::ProgramOptions::OptionGroup::~OptionGroup(OptionGroup *this)

{
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::~vector(&this->options_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

OptionGroup::~OptionGroup() {}